

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void write_macros_cb(void *ctx0,CTcHashEntryPp *entry)

{
  int iVar1;
  CTcHashEntryPp *pCVar2;
  CVmHashEntry *this;
  char *buf;
  CTcHashEntryPp *in_RSI;
  size_t *in_RDI;
  CTcHashEntryPpArg *arg;
  CVmFile *fp;
  int i;
  int flags;
  write_macro_ctx_t *ctx;
  char *in_stack_ffffffffffffff68;
  CVmFile *pCVar3;
  CTcTokenizer *in_stack_ffffffffffffff70;
  CVmFile *buflen;
  char *in_stack_ffffffffffffff78;
  CVmFile *in_stack_ffffffffffffff80;
  int local_20;
  undefined4 extraout_var;
  
  buflen = (CVmFile *)*in_RDI;
  iVar1 = (*(in_RSI->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[8])();
  if (iVar1 == 0) {
    CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
    CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
    pCVar2 = CTcTokenizer::find_undef(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x29d19f);
    if (pCVar2 == (CTcHashEntryPp *)0x0) {
      in_RDI[1] = in_RDI[1] + 1;
      CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
      CVmFile::write_uint2
                ((CVmFile *)in_stack_ffffffffffffff70,
                 (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
      CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
      CVmFile::write_bytes
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (size_t)in_stack_ffffffffffffff70);
      CTcHashEntryPp::has_args(in_RSI);
      CTcHashEntryPp::has_varargs(in_RSI);
      CVmFile::write_uint2
                ((CVmFile *)in_stack_ffffffffffffff70,
                 (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      CTcHashEntryPp::get_argc(in_RSI);
      CVmFile::write_uint2
                ((CVmFile *)in_stack_ffffffffffffff70,
                 (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      for (local_20 = 0; iVar1 = CTcHashEntryPp::get_argc(in_RSI), local_20 < iVar1;
          local_20 = local_20 + 1) {
        this = (CVmHashEntry *)CTcHashEntryPp::get_arg_entry(in_RSI,local_20);
        in_stack_ffffffffffffff80 = buflen;
        CVmHashEntry::getlen(this);
        CVmFile::write_uint2
                  ((CVmFile *)in_stack_ffffffffffffff70,
                   (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        CVmHashEntry::getstr(this);
        CVmHashEntry::getlen(this);
        CVmFile::write_bytes
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (size_t)in_stack_ffffffffffffff70);
      }
      pCVar3 = buflen;
      (*(in_RSI->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[6])();
      CVmFile::write_uint4((CVmFile *)in_stack_ffffffffffffff70,(uint)((ulong)pCVar3 >> 0x20));
      iVar1 = (*(in_RSI->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[5])();
      buf = (char *)CONCAT44(extraout_var,iVar1);
      (*(in_RSI->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[6])();
      CVmFile::write_bytes(in_stack_ffffffffffffff80,buf,(size_t)buflen);
    }
  }
  return;
}

Assistant:

static void write_macros_cb(void *ctx0, CTcHashEntryPp *entry)
{
    write_macro_ctx_t *ctx = (write_macro_ctx_t *)ctx0;
    int flags;
    int i;
    CVmFile *fp = ctx->fp;

    /* 
     *   if this is a pseudo-macro (such as __LINE__ or __FILE__), ignore it
     *   - these macros do not have permanent global definitions, so they're
     *   not usable in the debugger 
     */
    if (entry->is_pseudo())
        return;

    /* 
     *   If the macro was ever redefined or undefined, ignore it - the
     *   debugger can only use truly global macros, which are macros that
     *   have stable meanings throughout the compilation units where they
     *   appear (and which do not have different meanings in different
     *   compilation units, but that's not our concern at the moment).  The
     *   preprocessor keeps an "undef" table of everything undefined
     *   (explicitly, or implicitly via redefinition), so look up this macro
     *   in the undef table, and ignore the macro if it we find it.  
     */
    if (G_tok->find_undef(entry->getstr(), entry->getlen()) != 0)
        return;

    /* count this macro */
    ctx->cnt++;

    /* write the macro's name */
    fp->write_uint2(entry->getlen());
    fp->write_bytes(entry->getstr(), entry->getlen());

    /* write the flag bits */
    flags = 0;
    if (entry->has_args()) flags |= 1;
    if (entry->has_varargs()) flags |= 2;
    fp->write_uint2(flags);

    /* write the number of arguments, and write each argument */
    fp->write_uint2(entry->get_argc());
    for (i = 0 ; i < entry->get_argc() ; ++i)
    {
        CTcHashEntryPpArg *arg;

        /* get the argument */
        arg = entry->get_arg_entry(i);

        /* write the parameter name */
        fp->write_uint2(arg->getlen());
        fp->write_bytes(arg->getstr(), arg->getlen());
    }

    /* write the expansion */
    fp->write_uint4(entry->get_orig_expan_len());
    fp->write_bytes(entry->get_orig_expansion(), entry->get_orig_expan_len());
}